

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

bool __thiscall
glcts::TextureBufferTextureBufferRange::checkResult
          (TextureBufferTextureBufferRange *this,FormatInfo *info,char *phase,bool transformFeedback
          )

{
  value_type vVar1;
  code *pcVar2;
  uint uVar3;
  byte bVar4;
  char *pcVar5;
  int iVar6;
  deUint32 dVar7;
  GLenum GVar8;
  GLuint GVar9;
  GLuint GVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar12;
  reference pvVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  reference pvVar17;
  reference pvVar18;
  TestError *this_01;
  float fVar19;
  string local_720 [32];
  string local_700 [39];
  allocator<char> local_6d9;
  string local_6d8 [39];
  allocator<char> local_6b1;
  string local_6b0 [32];
  uint local_690;
  allocator<unsigned_int> local_689;
  GLuint i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> expected_2;
  GLuint *res_2;
  string local_648 [39];
  allocator<char> local_621;
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [32];
  uint local_5d8;
  allocator<int> local_5d1;
  GLuint i_1;
  vector<int,_std::allocator<int>_> expected_1;
  GLint *res_1;
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [32];
  uint local_520;
  allocator<float> local_519;
  GLuint i;
  vector<float,_std::allocator<float>_> expected;
  GLfloat *res;
  stringstream resVal;
  undefined1 local_4e8 [376];
  stringstream local_370 [8];
  stringstream expVal;
  undefined1 local_360 [376];
  char *local_1e8 [3];
  MessageBuilder local_1d0;
  int local_4c;
  int *piStack_48;
  GLint expectedSize;
  GLint *size;
  GLuint GStack_38;
  bool testResult;
  GLuint bufferValueId;
  GLuint bufferSizeId;
  GLenum bufferTarget;
  Functions *gl;
  char *pcStack_20;
  bool transformFeedback_local;
  char *phase_local;
  FormatInfo *info_local;
  TextureBufferTextureBufferRange *this_local;
  
  gl._7_1_ = transformFeedback;
  pcStack_20 = phase;
  phase_local = (char *)info;
  info_local = (FormatInfo *)this;
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar6 = (*pRVar11->_vptr_RenderContext[3])();
  _bufferSizeId = CONCAT44(extraout_var,iVar6);
  if ((gl._7_1_ & 1) == 0) {
    bufferValueId = 0x90d2;
    GStack_38 = this->m_ssbo_size_id;
    size._4_4_ = this->m_ssbo_value_id;
  }
  else {
    bufferValueId = 0x8c8e;
    GStack_38 = this->m_tf_size_buffer_id;
    size._4_4_ = this->m_tf_value_buffer_id;
  }
  size._3_1_ = 1;
  (**(code **)(_bufferSizeId + 0x40))(bufferValueId,GStack_38);
  dVar7 = (**(code **)(_bufferSizeId + 0x800))();
  glu::checkError(dVar7,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x437);
  piStack_48 = (int *)(**(code **)(_bufferSizeId + 0xd00))(bufferValueId,0,4,1);
  dVar7 = (**(code **)(_bufferSizeId + 0x800))();
  glu::checkError(dVar7,"Error mapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x43a);
  local_4c = 1;
  if (*piStack_48 != 1) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_1d0,(char (*) [27])"Texture size is wrong for ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&stack0xffffffffffffffe0);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [9])" phase \n");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [18])"Internal Format: ");
    GVar8 = FormatInfo::get_internal_format((FormatInfo *)phase_local);
    local_1e8[0] = glu::getUncompressedTextureFormatName(GVar8);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_1e8);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [18])"Expected size:   ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_4c);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [18])"Result size:     ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&stack0xffffffffffffffb8);
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [2])0x2b9e07b);
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  }
  (**(code **)(_bufferSizeId + 0x1670))(bufferValueId);
  dVar7 = (**(code **)(_bufferSizeId + 0x800))();
  glu::checkError(dVar7,"Error unmapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,1099);
  (**(code **)(_bufferSizeId + 0x40))(bufferValueId,size._4_4_);
  dVar7 = (**(code **)(_bufferSizeId + 0x800))();
  glu::checkError(dVar7,"Error binding buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x44e);
  std::__cxx11::stringstream::stringstream(local_370);
  std::__cxx11::stringstream::stringstream((stringstream *)&res);
  GVar8 = FormatInfo::get_output_type((FormatInfo *)phase_local);
  GVar10 = bufferValueId;
  if (GVar8 == 0x1404) {
    pcVar2 = *(code **)(_bufferSizeId + 0xd00);
    GVar9 = FormatInfo::get_ssbo_value_size((FormatInfo *)phase_local);
    expected_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(*pcVar2)(GVar10,0,GVar9,1);
    dVar7 = (**(code **)(_bufferSizeId + 0x800))();
    glu::checkError(dVar7,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x475);
    GVar10 = FormatInfo::get_n_components((FormatInfo *)phase_local);
    std::allocator<int>::allocator(&local_5d1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)GVar10,&local_5d1);
    std::allocator<int>::~allocator(&local_5d1);
    pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i_1,0);
    fillOutputData(this,(GLubyte *)pvVar17,(FormatInfo *)phase_local);
    local_5d8 = 0;
    while( true ) {
      uVar3 = local_5d8;
      GVar10 = FormatInfo::get_n_components((FormatInfo *)phase_local);
      if (GVar10 <= uVar3) break;
      iVar6 = expected_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[local_5d8];
      pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)local_5d8);
      if (iVar6 != *pvVar17) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_5f8,"",&local_5f9);
        std::__cxx11::stringstream::str((string *)local_370);
        std::__cxx11::string::~string(local_5f8);
        std::allocator<char>::~allocator(&local_5f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_620,"",&local_621);
        std::__cxx11::stringstream::str((string *)&res);
        std::__cxx11::string::~string(local_620);
        std::allocator<char>::~allocator(&local_621);
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)local_5d8);
        std::ostream::operator<<(local_360,*pvVar17);
        std::ostream::operator<<
                  (local_4e8,
                   expected_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[local_5d8]);
        pcVar5 = pcStack_20;
        GVar8 = FormatInfo::get_internal_format((FormatInfo *)phase_local);
        pcVar14 = glu::getUncompressedTextureFormatName(GVar8);
        uVar3 = local_5d8;
        std::__cxx11::stringstream::str();
        pcVar15 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        pcVar16 = (char *)std::__cxx11::string::c_str();
        logError(this,pcVar5,pcVar14,uVar3,pcVar15,pcVar16);
        std::__cxx11::string::~string((string *)&res_2);
        std::__cxx11::string::~string(local_648);
        size._3_1_ = 0;
      }
      local_5d8 = local_5d8 + 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_1);
  }
  else if (GVar8 == 0x1405) {
    pcVar2 = *(code **)(_bufferSizeId + 0xd00);
    GVar9 = FormatInfo::get_ssbo_value_size((FormatInfo *)phase_local);
    expected_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(*pcVar2)(GVar10,0,GVar9,1);
    dVar7 = (**(code **)(_bufferSizeId + 0x800))();
    glu::checkError(dVar7,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x491);
    GVar10 = FormatInfo::get_n_components((FormatInfo *)phase_local);
    std::allocator<unsigned_int>::allocator(&local_689);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,(ulong)GVar10,&local_689)
    ;
    std::allocator<unsigned_int>::~allocator(&local_689);
    pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,0);
    fillOutputData(this,(GLubyte *)pvVar18,(FormatInfo *)phase_local);
    local_690 = 0;
    while( true ) {
      uVar3 = local_690;
      GVar10 = FormatInfo::get_n_components((FormatInfo *)phase_local);
      if (GVar10 <= uVar3) break;
      vVar1 = expected_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[local_690];
      pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,
                           (ulong)local_690);
      if (vVar1 != *pvVar18) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_6b0,"",&local_6b1);
        std::__cxx11::stringstream::str((string *)local_370);
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator(&local_6b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_6d8,"",&local_6d9);
        std::__cxx11::stringstream::str((string *)&res);
        std::__cxx11::string::~string(local_6d8);
        std::allocator<char>::~allocator(&local_6d9);
        pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,
                             (ulong)local_690);
        std::ostream::operator<<(local_360,*pvVar18);
        std::ostream::operator<<
                  (local_4e8,
                   expected_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage[local_690]);
        pcVar5 = pcStack_20;
        GVar8 = FormatInfo::get_internal_format((FormatInfo *)phase_local);
        pcVar14 = glu::getUncompressedTextureFormatName(GVar8);
        uVar3 = local_690;
        std::__cxx11::stringstream::str();
        pcVar15 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        pcVar16 = (char *)std::__cxx11::string::c_str();
        logError(this,pcVar5,pcVar14,uVar3,pcVar15,pcVar16);
        std::__cxx11::string::~string(local_720);
        std::__cxx11::string::~string(local_700);
        size._3_1_ = 0;
      }
      local_690 = local_690 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2);
  }
  else {
    if (GVar8 != 0x1406) {
      (**(code **)(_bufferSizeId + 0x1670))(bufferValueId);
      dVar7 = (**(code **)(_bufferSizeId + 0x800))();
      glu::checkError(dVar7,"Error ummapping buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                      ,0x4ac);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Not allowed output type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                 ,0x4ae);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar2 = *(code **)(_bufferSizeId + 0xd00);
    GVar9 = FormatInfo::get_ssbo_value_size((FormatInfo *)phase_local);
    expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(*pcVar2)(GVar10,0,GVar9,1);
    dVar7 = (**(code **)(_bufferSizeId + 0x800))();
    glu::checkError(dVar7,"Error mapping buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                    ,0x45a);
    GVar10 = FormatInfo::get_n_components((FormatInfo *)phase_local);
    std::allocator<float>::allocator(&local_519);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i,(ulong)GVar10,&local_519);
    std::allocator<float>::~allocator(&local_519);
    pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&i,0);
    fillOutputData(this,(GLubyte *)pvVar13,(FormatInfo *)phase_local);
    local_520 = 0;
    while( true ) {
      uVar3 = local_520;
      GVar10 = FormatInfo::get_n_components((FormatInfo *)phase_local);
      if (GVar10 <= uVar3) break;
      fVar19 = expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[local_520];
      pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)&i,(ulong)local_520);
      fVar19 = de::abs<float>(fVar19 - *pvVar13);
      if (0.0001 < fVar19) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_540,"",&local_541);
        std::__cxx11::stringstream::str((string *)local_370);
        std::__cxx11::string::~string(local_540);
        std::allocator<char>::~allocator(&local_541);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_568,"",&local_569);
        std::__cxx11::stringstream::str((string *)&res);
        std::__cxx11::string::~string(local_568);
        std::allocator<char>::~allocator(&local_569);
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&i,(ulong)local_520);
        std::ostream::operator<<(local_360,*pvVar13);
        std::ostream::operator<<
                  (local_4e8,
                   expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[local_520]);
        pcVar5 = pcStack_20;
        GVar8 = FormatInfo::get_internal_format((FormatInfo *)phase_local);
        pcVar14 = glu::getUncompressedTextureFormatName(GVar8);
        uVar3 = local_520;
        std::__cxx11::stringstream::str();
        pcVar15 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        pcVar16 = (char *)std::__cxx11::string::c_str();
        logError(this,pcVar5,pcVar14,uVar3,pcVar15,pcVar16);
        std::__cxx11::string::~string((string *)&res_1);
        std::__cxx11::string::~string(local_590);
        size._3_1_ = 0;
      }
      local_520 = local_520 + 1;
    }
    std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&i)
    ;
  }
  (**(code **)(_bufferSizeId + 0x1670))(bufferValueId);
  dVar7 = (**(code **)(_bufferSizeId + 0x800))();
  glu::checkError(dVar7,"Error ummapping buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x4b3);
  bVar4 = size._3_1_;
  std::__cxx11::stringstream::~stringstream((stringstream *)&res);
  std::__cxx11::stringstream::~stringstream(local_370);
  return (bool)(bVar4 & 1);
}

Assistant:

bool TextureBufferTextureBufferRange::checkResult(FormatInfo& info, const char* phase, bool transformFeedback)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum bufferTarget  = GL_NONE;
	glw::GLuint bufferSizeId  = GL_NONE;
	glw::GLuint bufferValueId = GL_NONE;

	if (transformFeedback)
	{
		bufferTarget  = GL_TRANSFORM_FEEDBACK_BUFFER;
		bufferSizeId  = m_tf_size_buffer_id;
		bufferValueId = m_tf_value_buffer_id;
	}
	else
	{
		bufferTarget  = GL_SHADER_STORAGE_BUFFER;
		bufferSizeId  = m_ssbo_size_id;
		bufferValueId = m_ssbo_value_id;
	}

	bool testResult = true;

	/* Get result data */
	gl.bindBuffer(bufferTarget, bufferSizeId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	glw::GLint* size = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, sizeof(glw::GLint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

	const glw::GLint expectedSize = 1;

	/* Reagrding test specification size should be equal 1*/
	/* Log error if expected and result data are not equal */
	if (*size != expectedSize)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size is wrong for " << phase << " phase \n"
						   << "Internal Format: " << glu::getUncompressedTextureFormatName(info.get_internal_format())
						   << "\n"
						   << "Expected size:   " << expectedSize << "\n"
						   << "Result size:     " << size << "\n"
						   << tcu::TestLog::EndMessage;
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer!");

	gl.bindBuffer(bufferTarget, bufferValueId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer!");

	std::stringstream expVal;
	std::stringstream resVal;

	/* Log error if expected and result data are not equal */
	switch (info.get_output_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* res =
			(glw::GLfloat*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLfloat> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (de::abs(res[i] - expected[i]) > m_epsilon_float)
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_INT:
	{
		glw::GLint* res = (glw::GLint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	case GL_UNSIGNED_INT:
	{
		glw::GLuint* res =
			(glw::GLuint*)gl.mapBufferRange(bufferTarget, 0, info.get_ssbo_value_size(), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer!");

		std::vector<glw::GLuint> expected(info.get_n_components());

		fillOutputData(reinterpret_cast<glw::GLubyte*>(&expected[0]), info);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			if (res[i] != expected[i])
			{
				expVal.str("");
				resVal.str("");
				expVal << expected[i];
				resVal << res[i];

				logError(phase, glu::getUncompressedTextureFormatName(info.get_internal_format()), i,
						 expVal.str().c_str(), resVal.str().c_str());

				testResult = false;
			}
		}
	}
	break;

	default:
	{
		gl.unmapBuffer(bufferTarget);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

		TCU_FAIL("Not allowed output type");
	}
	}

	gl.unmapBuffer(bufferTarget);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping buffer!");

	return testResult;
}